

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

QByteArrayView __thiscall Moc::strippedFileName(Moc *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  QByteArrayView QVar7;
  
  pcVar2 = (this->filename).d.ptr;
  pcVar1 = (char *)(this->filename).d.size;
  uVar6 = (uint)pcVar1 & 3;
  pcVar3 = pcVar2 + uVar6;
  pcVar5 = pcVar2;
  for (uVar4 = (ulong)pcVar1 >> 2; 0 < (long)uVar4; uVar4 = uVar4 - 1) {
    if ((pcVar5[(long)(pcVar1 + -1)] == '/') || (pcVar5[(long)(pcVar1 + -1)] == '\\')) {
      pcVar3 = pcVar5 + (long)pcVar1;
      goto LAB_00118d06;
    }
    if ((pcVar5[(long)(pcVar1 + -2)] == '/') || (pcVar5[(long)(pcVar1 + -2)] == '\\')) {
      pcVar3 = pcVar5 + (long)(pcVar1 + -1);
      goto LAB_00118d06;
    }
    if ((pcVar5[(long)(pcVar1 + -3)] == '/') || (pcVar5[(long)(pcVar1 + -3)] == '\\')) {
      pcVar3 = pcVar5 + (long)(pcVar1 + -2);
      goto LAB_00118d06;
    }
    if ((pcVar5[(long)(pcVar1 + -4)] == '/') || (pcVar5[(long)(pcVar1 + -4)] == '\\')) {
      pcVar3 = pcVar5 + (long)(pcVar1 + -3);
      goto LAB_00118d06;
    }
    pcVar5 = pcVar5 + -4;
  }
  switch(uVar6) {
  case 0:
    goto switchD_00118d26_caseD_0;
  case 1:
switchD_00118d26_caseD_1:
    if ((pcVar3[-1] != '/') && (pcVar3[-1] != '\\')) goto switchD_00118d26_caseD_0;
    break;
  case 2:
switchD_00118d26_caseD_2:
    if ((pcVar3[-1] != '/') && (pcVar3[-1] != '\\')) {
      pcVar3 = pcVar3 + -1;
      goto switchD_00118d26_caseD_1;
    }
    break;
  case 3:
    if ((pcVar3[-1] != '/') && (pcVar3[-1] != '\\')) {
      pcVar3 = pcVar3 + -1;
      goto switchD_00118d26_caseD_2;
    }
  }
LAB_00118d06:
  if (pcVar3 != pcVar2) {
    pcVar3 = pcVar2 + ((long)pcVar1 - (long)pcVar3);
    pcVar2 = pcVar2 + ((long)pcVar1 - (long)pcVar3);
    pcVar1 = pcVar3;
  }
switchD_00118d26_caseD_0:
  QVar7.m_data = pcVar2;
  QVar7.m_size = (qsizetype)pcVar1;
  return QVar7;
}

Assistant:

const T *data() const noexcept { return ptr; }